

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O1

void __thiscall CVmMemorySourceList::add_block(CVmMemorySourceList *this)

{
  CVmMemorySourceBlock *pCVar1;
  CVmMemorySourceBlock *pCVar2;
  CVmMemorySourceBlock *pCVar3;
  long lVar4;
  
  pCVar1 = this->last_block_;
  if (pCVar1 == (CVmMemorySourceBlock *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = pCVar1->ofs + 0x1000;
  }
  pCVar2 = (CVmMemorySourceBlock *)operator_new(0x1010);
  pCVar2->ofs = lVar4;
  pCVar2->nxt = (CVmMemorySourceBlock *)0x0;
  pCVar3 = (CVmMemorySourceBlock *)&this->first_block_;
  if (pCVar1 != (CVmMemorySourceBlock *)0x0) {
    pCVar3 = pCVar1;
  }
  pCVar3->nxt = pCVar2;
  this->last_block_ = pCVar2;
  return;
}

Assistant:

void add_block()
    {
        long ofs = last_block_ == 0 ? 0 : last_block_->ofs + BlockLen;
        CVmMemorySourceBlock *b = new CVmMemorySourceBlock(ofs);

        if (last_block_ != 0)
            last_block_->nxt = b;
        else
            first_block_ = b;
        last_block_ = b;
    }